

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handle.cpp
# Opt level: O2

string * __thiscall remote::Handle::GetPath_abi_cxx11_(string *__return_storage_ptr__,Handle *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  GetProcDirectory_abi_cxx11_(&local_30,this);
  std::operator+(&local_50,&local_30,"/exe");
  FileSystem::ResolveSymLink(__return_storage_ptr__,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string Handle::GetPath() {
    return FileSystem::ResolveSymLink(GetProcDirectory() + "/exe");
}